

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

int __thiscall
CAPSFile::DecompressData
          (CAPSFile *this,IDisk *disk,uint ctype,uint cyl,uint head,DataChunks imageItem)

{
  uint density_buf_size_00;
  uint track_buf_size_00;
  int track_buf_size;
  int density_buf_size;
  int offset;
  uint head_local;
  uint cyl_local;
  uint ctype_local;
  IDisk *disk_local;
  CAPSFile *this_local;
  
  density_buf_size_00 = ExtractInt(imageItem.buffer);
  track_buf_size_00 = ExtractInt(imageItem.buffer + 4);
  ExtractDensity(this,imageItem.buffer + 8,density_buf_size_00,ctype,cyl,head);
  ExtractTrack(this,disk,imageItem.buffer + (int)(density_buf_size_00 + 8),track_buf_size_00,ctype,
               cyl,head);
  return 0;
}

Assistant:

int CAPSFile::DecompressData(IDisk* disk, DWORD ctype, DWORD cyl, DWORD head, DataChunks imageItem)
{
   // Get the DATA buffer :

   // First PACK size
   int offset = 0;
   int density_buf_size = ExtractInt(&imageItem.buffer[offset]);
   offset += 4;
   // Second PACK size
   int track_buf_size = ExtractInt(&imageItem.buffer[offset]);
   offset += 4;

   // First pack is density information
   ExtractDensity(&imageItem.buffer[offset], density_buf_size, ctype, cyl, head);
   offset += density_buf_size;

   // Second one is track informations
   ExtractTrack(disk, &imageItem.buffer[offset], track_buf_size, ctype, cyl, head);

   return 0;
}